

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

float GD::sensitivity<false,true,false,0ul,0ul,0ul>(gd *g,base_learner *param_2,example *ec)

{
  example *in_RDX;
  gd *in_RSI;
  gd *in_RDI;
  float fVar1;
  float fVar2;
  float in_stack_ffffffffffffffe4;
  
  fVar1 = get_scale<0ul>(in_RSI,in_RDX,in_stack_ffffffffffffffe4);
  fVar2 = sensitivity<false,true,false,0ul,0ul,0ul,true>(in_RDI,in_RDX);
  return fVar1 * fVar2;
}

Assistant:

float sensitivity(gd& g, base_learner& /* base */, example& ec)
{
  return get_scale<adaptive>(g, ec, 1.) *
      sensitivity<sqrt_rate, feature_mask_off, adax, adaptive, normalized, spare, true>(g, ec);
}